

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::FieldMaskUtil::IsPathInFieldMask
          (FieldMaskUtil *this,string_view path,FieldMask *mask)

{
  int iVar1;
  pointer pcVar2;
  Nonnull<absl::string_view_*> str;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar3;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar4;
  pointer pcVar5;
  int i;
  int index;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view expected;
  string_view expected_00;
  Nonnull<absl::string_view_*> local_50;
  char *local_48;
  Nonnull<absl::string_view_*> local_40;
  char *local_38;
  
  local_38 = (char *)path._M_len;
  local_40 = (Nonnull<absl::string_view_*>)this;
  for (index = 0; iVar1 = *(int *)(path._M_str + 0x18), index < iVar1; index = index + 1) {
    local_50 = local_40;
    local_48 = local_38;
    pVVar4 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                       ((RepeatedPtrFieldBase *)(path._M_str + 0x10),index);
    pcVar2 = (pVVar4->_M_dataplus)._M_p;
    str = (Nonnull<absl::string_view_*>)pVVar4->_M_string_length;
    __x._M_str = local_48;
    __x._M_len = (size_t)local_50;
    __y._M_str = pcVar2;
    __y._M_len = (size_t)str;
    pcVar5 = pcVar2;
    bVar3 = std::operator==(__x,__y);
    if (bVar3) break;
    if (str < local_50) {
      expected._M_str = pcVar5;
      expected._M_len = (size_t)pcVar2;
      bVar3 = absl::lts_20240722::ConsumePrefix((lts_20240722 *)&local_50,str,expected);
      if (bVar3) {
        expected_00._M_str = pcVar5;
        expected_00._M_len = (size_t)".";
        bVar3 = absl::lts_20240722::ConsumePrefix
                          ((lts_20240722 *)&local_50,(Nonnull<absl::string_view_*>)0x1,expected_00);
        if (bVar3) break;
      }
    }
  }
  return index < iVar1;
}

Assistant:

bool FieldMaskUtil::IsPathInFieldMask(absl::string_view path,
                                      const FieldMask& mask) {
  for (int i = 0; i < mask.paths_size(); ++i) {
    absl::string_view current = path;
    absl::string_view mask_path = mask.paths(i);
    if (current == mask_path) {
      return true;
    }
      // Also check whether mask.paths(i) is a prefix of path.
    if (mask_path.length() < current.length() &&
        absl::ConsumePrefix(&current, mask_path) &&
        absl::ConsumePrefix(&current, ".")) {
      return true;
    }
  }
  return false;
}